

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O2

void initialize_random_artifacts(uint32_t randart_seed)

{
  _Bool **dest;
  artifact *art;
  artifact_upkeep *paVar1;
  bitflag *pbVar2;
  ushort uVar3;
  effect *effect1;
  effect *effect2;
  artifact *paVar4;
  char ***sections;
  _Bool _Var5;
  uint32_t uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  ang_file *f;
  long lVar11;
  char *pcVar12;
  object_kind *poVar13;
  angband_constants *paVar14;
  wchar_t wVar15;
  int iVar16;
  wchar_t wVar17;
  char *pcVar18;
  wchar_t wVar19;
  activation *paVar20;
  ulong uVar21;
  bool bVar22;
  byte bVar23;
  undefined1 auVar24 [16];
  char word [1024];
  char fname [1024];
  char local_438 [1032];
  
  bVar23 = 0;
  Rand_quick = true;
  Rand_value = randart_seed;
  path_build(fname,0x400,ANGBAND_DIR_USER,"randart.txt");
  f = file_open(fname,MODE_WRITE,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    quit_fmt("Error - can\'t create %s.",fname);
  }
  file_putf(f,"# Artifact file for random artifacts with seed %08x\n\n\n",randart_seed);
  a_info = (artifact *)mem_realloc(a_info,(ulong)z_info->a_max * 0x140 + 0x3200);
  aup_info = (artifact_upkeep *)mem_realloc(aup_info,(ulong)z_info->a_max * 8 + 0x140);
  iVar10 = 0;
  do {
    paVar4 = a_info;
    if (iVar10 == 0x28) {
      _Var5 = file_close(f);
      if (!_Var5) {
        quit_fmt("Error - can\'t close %s.",fname);
      }
      return;
    }
    uVar3 = z_info->a_max;
    art = a_info + uVar3;
    memset(art,0,0x140);
    paVar1 = aup_info + z_info->a_max;
    paVar1->aidx = 0;
    paVar1->created = false;
    paVar1->seen = false;
    paVar1->everseen = false;
    paVar1->field_0x7 = 0;
    aup_info[z_info->a_max].aidx = (uint)z_info->a_max;
    memset(art,0,0x140);
    do {
      do {
        uVar6 = Rand_div((uint)z_info->k_max);
      } while (k_info[(int)uVar6].name == (char *)0x0);
      poVar13 = k_info + (int)uVar6;
    } while (((poVar13->alloc_prob == L'\0') || (_Var5 = tval_can_be_artifact_k(poVar13), !_Var5))
            || (uVar6 = Rand_div((uint32_t)(100 / (long)poVar13->alloc_prob)), uVar6 != 0));
    wVar9 = poVar13->sval;
    art->tval = poVar13->tval;
    art->sval = wVar9;
    wVar9 = (poVar13->to_d).base;
    wVar15 = (poVar13->to_h).base;
    auVar24._0_4_ = (uint)(wVar15 - (wVar15 >> 0x1f)) >> 1;
    auVar24._4_4_ = (uint)(wVar9 - (wVar9 >> 0x1f)) >> 1;
    auVar24._8_8_ = 0;
    auVar24 = pshuflw(auVar24,auVar24,0xe8);
    art->to_h = (short)auVar24._0_4_;
    art->to_d = (short)((uint)auVar24._0_4_ >> 0x10);
    art->to_a = (int16_t)((poVar13->to_a).base / 2);
    art->ac = (int16_t)poVar13->ac;
    art->dd = (uint8_t)poVar13->dd;
    art->ds = (uint8_t)poVar13->ds;
    if (L'ᎇ' < poVar13->cost) {
      art->cost = poVar13->cost;
    }
    art->weight = poVar13->weight;
    flag_copy(art->flags,poVar13->flags,6);
    for (lVar11 = 0; lVar11 != 0x1c; lVar11 = lVar11 + 1) {
      art->el_info[lVar11].res_level = poVar13->el_info[lVar11].res_level;
    }
    for (lVar11 = 0; lVar11 != 0x22; lVar11 = lVar11 + 2) {
      *(short *)((long)art->modifiers + lVar11) = (short)(&poVar13->modifiers[0].base)[lVar11 * 2];
    }
    copy_slays(&art->slays,poVar13->slays);
    dest = &art->brands;
    copy_brands(dest,poVar13->brands);
    effect1 = poVar13->effect;
    lVar11 = 0;
    paVar14 = z_info;
    for (uVar21 = 0; paVar20 = activations, uVar21 < paVar14->act_max; uVar21 = uVar21 + 1) {
      effect2 = *(effect **)((long)&activations->effect + lVar11);
      if ((effect2 != (effect *)0x0) &&
         (_Var5 = effect_equal(effect1,effect2), paVar14 = z_info, !_Var5)) {
        paVar20 = (activation *)((long)&paVar20->next + lVar11);
        goto LAB_00183848;
      }
      lVar11 = lVar11 + 0x48;
    }
    paVar20 = (activation *)0x0;
LAB_00183848:
    art->activation = paVar20;
    wVar9 = (poVar13->time).dice;
    wVar15 = (poVar13->time).sides;
    wVar17 = (poVar13->time).m_bonus;
    (art->time).base = (poVar13->time).base;
    (art->time).dice = wVar9;
    (art->time).sides = wVar15;
    (art->time).m_bonus = wVar17;
    for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
      pbVar2 = &paVar4[uVar3].el_info[lVar11].flags;
      *pbVar2 = *pbVar2 | 2;
    }
    potential = L'ۖ';
    iVar16 = 0xe;
    while ((bVar22 = iVar16 != 0, iVar16 = iVar16 + -1, bVar22 &&
           (uVar6 = Rand_div(0xf), 1 < (int)uVar6))) {
      potential = potential + L'Ǵ';
    }
    wVar9 = poVar13->power;
    wVar15 = potential - wVar9;
    if (wVar15 < L'ۗ') {
      wVar15 = L'ۖ';
    }
    max_potential = poVar13->base->potential;
    if (max_potential <= wVar15) {
      wVar15 = max_potential;
    }
    potential = wVar15;
    initial_potential = wVar15;
    art->cost = art->cost + wVar15 * 10;
    wVar7 = wVar15 / 100;
    wVar17 = poVar13->alloc_min;
    wVar19 = wVar17;
    if (wVar17 < wVar7) {
      wVar19 = wVar7;
    }
    wVar8 = L'\x05';
    if (L'\x0e' < wVar19) {
      if (wVar7 < wVar17) {
        wVar8 = wVar17 + L'\xfffffff6';
      }
      else {
        wVar8 = wVar7 + L'\xfffffff6';
      }
    }
    art->alloc_min = wVar8;
    wVar17 = (wVar8 - wVar17) + poVar13->alloc_max;
    if (L'~' < wVar17) {
      wVar17 = L'\x7f';
    }
    art->alloc_max = wVar17;
    wVar9 = ((int)(10000 / (long)(wVar15 + wVar9)) * 100) / poVar13->alloc_prob;
    if (L'\x1d' < wVar9) {
      wVar9 = L'\x1e';
    }
    art->alloc_prob = wVar9;
    choose_artifact_theme(art);
    haggle_till_done(art,(object *)0x0);
    uVar6 = Rand_div(100);
    if ((int)uVar6 < 5) {
      make_terrible(art,(object *)0x0);
    }
    final_check(art,(object *)0x0);
    paVar20 = art->activation;
    wVar9 = art->tval;
    if ((paVar20 != (activation *)0x0) && (paVar20 != k_info[wVar9].activation)) {
      if ((paVar20->time).base == L'\0') {
        iVar16 = paVar20->power << 3;
        (art->time).base = iVar16;
        (art->time).dice = 1;
        (art->time).sides = iVar16;
      }
      else {
        wVar15 = (paVar20->time).dice;
        wVar17 = (paVar20->time).sides;
        wVar19 = (paVar20->time).m_bonus;
        (art->time).base = (paVar20->time).base;
        (art->time).dice = wVar15;
        (art->time).sides = wVar17;
        (art->time).m_bonus = wVar19;
      }
    }
    pcVar12 = "Random ";
    pcVar18 = word;
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      *(undefined8 *)pcVar18 = *(undefined8 *)pcVar12;
      pcVar12 = pcVar12 + ((ulong)bVar23 * -2 + 1) * 8;
      pcVar18 = pcVar18 + (ulong)bVar23 * -0x10 + 8;
    }
    pcVar12 = tval_find_name(wVar9);
    my_strcat(word,pcVar12,0x80);
    pcVar12 = format(" of power %d",(ulong)(uint)initial_potential);
    my_strcat(word,pcVar12,0x80);
    string_free(art->text);
    pcVar12 = string_make(word);
    art->text = pcVar12;
    sections = name_sections;
    wVar9 = Rand_div(max_potential);
    if ((wVar9 < initial_potential) && (uVar6 = Rand_div(2), uVar6 != 0)) {
      find_word_art_name[0] = 0;
      wVar9 = art->cost;
      _Var5 = tval_is_weapon_a(art);
      pcVar12 = "a_cursed.txt";
      if (_Var5) {
        pcVar12 = "w_cursed.txt";
      }
      pcVar18 = "a_normal.txt";
      if (_Var5) {
        pcVar18 = "w_normal.txt";
      }
      if (wVar9 == L'\0') {
        pcVar18 = pcVar12;
      }
      get_rnd_line(pcVar18,find_word_art_name);
      my_strcpy(word,find_word_art_name,0x400);
      my_strcpy(local_438,word,0x400);
    }
    else {
      randname_make(RANDNAME_TOLKIEN,5,9,word,0x400,sections);
      my_strcap(word);
      uVar6 = Rand_div(3);
      if (uVar6 == 0) {
        pcVar12 = "\'%s\'";
      }
      else {
        pcVar12 = "of %s";
      }
      pcVar12 = format(pcVar12,word);
      my_strcpy(local_438,pcVar12,0x400);
    }
    pcVar12 = string_make(word);
    art->name = pcVar12;
    art->aidx = (uint)z_info->a_max;
    word[0x60] = '\0';
    word[0x61] = '\0';
    word[0x62] = '\0';
    word[99] = '\0';
    word[100] = '\0';
    word[0x65] = '\0';
    word[0x66] = '\0';
    word[0x67] = '\0';
    word[0x68] = '\0';
    word[0x69] = '\0';
    word[0x6a] = '\0';
    word[0x6b] = '\0';
    word[0x6c] = '\0';
    word[0x6d] = '\0';
    word[0x6e] = '\0';
    word[0x6f] = '\0';
    word[0x50] = '\0';
    word[0x51] = '\0';
    word[0x52] = '\0';
    word[0x53] = '\0';
    word[0x54] = '\0';
    word[0x55] = '\0';
    word[0x56] = '\0';
    word[0x57] = '\0';
    word[0x58] = '\0';
    word[0x59] = '\0';
    word[0x5a] = '\0';
    word[0x5b] = '\0';
    word[0x5c] = '\0';
    word[0x5d] = '\0';
    word[0x5e] = '\0';
    word[0x5f] = '\0';
    word[0x40] = '\0';
    word[0x41] = '\0';
    word[0x42] = '\0';
    word[0x43] = '\0';
    word[0x44] = '\0';
    word[0x45] = '\0';
    word[0x46] = '\0';
    word[0x47] = '\0';
    word[0x48] = '\0';
    word[0x49] = '\0';
    word[0x4a] = '\0';
    word[0x4b] = '\0';
    word[0x4c] = '\0';
    word[0x4d] = '\0';
    word[0x4e] = '\0';
    word[0x4f] = '\0';
    word[0x30] = '\0';
    word[0x31] = '\0';
    word[0x32] = '\0';
    word[0x33] = '\0';
    word[0x34] = '\0';
    word[0x35] = '\0';
    word[0x36] = '\0';
    word[0x37] = '\0';
    word[0x38] = '\0';
    word[0x39] = '\0';
    word[0x3a] = '\0';
    word[0x3b] = '\0';
    word[0x3c] = '\0';
    word[0x3d] = '\0';
    word[0x3e] = '\0';
    word[0x3f] = '\0';
    word[0x20] = '\0';
    word[0x21] = '\0';
    word[0x22] = '\0';
    word[0x23] = '\0';
    word[0x24] = '\0';
    word[0x25] = '\0';
    word[0x26] = '\0';
    word[0x27] = '\0';
    word[0x28] = '\0';
    word[0x29] = '\0';
    word[0x2a] = '\0';
    word[0x2b] = '\0';
    word[0x2c] = '\0';
    word[0x2d] = '\0';
    word[0x2e] = '\0';
    word[0x2f] = '\0';
    word[0x70] = '\0';
    word[0x71] = '\0';
    word[0x72] = '\0';
    word[0x73] = '\0';
    word[0x74] = '\0';
    word[0x75] = '\0';
    word[0x76] = '\0';
    word[0x77] = '\0';
    word[0x10] = '\0';
    word[0x11] = '\0';
    word[0x12] = '\0';
    word[0x13] = '\0';
    word[0x14] = '\0';
    word[0x15] = '\0';
    word[0x16] = '\0';
    word[0x17] = '\0';
    word[0x18] = '\0';
    word[0x19] = '\0';
    word[0x1a] = '\0';
    word[0x1b] = '\0';
    word[0x1c] = '\0';
    word[0x1d] = '\0';
    word[0x1e] = '\0';
    word[0x1f] = '\0';
    word[0] = '\0';
    word[1] = '\0';
    word[2] = '\0';
    word[3] = '\0';
    word[4] = '\0';
    word[5] = '\0';
    word[6] = '\0';
    word[7] = '\0';
    word[8] = '\0';
    word[9] = '\0';
    word[10] = '\0';
    word[0xb] = '\0';
    word[0xc] = '\0';
    word[0xd] = '\0';
    word[0xe] = '\0';
    word[0xf] = '\0';
    poVar13 = lookup_kind(art->tval,art->sval);
    if (art->name != (char *)0x0) {
      file_putf(f,"# %s\n",art->text);
      file_putf(f,"name:%s\n",art->name);
      object_short_name(word,0x78,poVar13->name);
      pcVar12 = tval_find_name(art->tval);
      file_putf(f,"base-object:%s:%s\n",pcVar12,word);
      if ((uint)z_info->ordinary_kind_max <= poVar13->kidx) {
        pcVar12 = attr_to_text(poVar13->d_attr);
        file_putf(f,"graphics:%c:%s\n",(ulong)(uint)poVar13->d_char,pcVar12);
      }
      file_putf(f,"level:%d\n",(ulong)(uint)art->level);
      file_putf(f,"weight:%d\n",(ulong)(uint)art->weight);
      file_putf(f,"cost:%d\n",(ulong)(uint)art->cost);
      file_putf(f,"alloc:%d:%d to %d\n",(ulong)(uint)art->alloc_prob,(ulong)(uint)art->alloc_min,
                (ulong)(uint)art->alloc_max);
      file_putf(f,"attack:%dd%d:%d:%d\n",(ulong)art->dd,(ulong)art->ds,(ulong)(uint)(int)art->to_h,
                (ulong)(uint)(int)art->to_d);
      file_putf(f,"armor:%d:%d\n",(ulong)(uint)(int)art->ac,(ulong)(uint)(int)art->to_a);
      write_flags(f,"flags:",art->flags,6,(char **)write_randart_file_entry_obj_flags);
      write_mods(f,art->modifiers);
      write_elements(f,art->el_info);
      if (art->slays != (_Bool *)0x0) {
        lVar11 = 0x38;
        paVar14 = z_info;
        for (uVar21 = 1; uVar21 < paVar14->slay_max; uVar21 = uVar21 + 1) {
          if (art->slays[uVar21] == true) {
            file_putf(f,"slay:%s\n",*(undefined8 *)((long)&slays->code + lVar11));
            paVar14 = z_info;
          }
          lVar11 = lVar11 + 0x38;
        }
      }
      if (*dest != (_Bool *)0x0) {
        lVar11 = 0x30;
        paVar14 = z_info;
        for (uVar21 = 1; uVar21 < paVar14->brand_max; uVar21 = uVar21 + 1) {
          if ((*dest)[uVar21] == true) {
            file_putf(f,"brand:%s\n",*(undefined8 *)((long)&brands->code + lVar11));
            paVar14 = z_info;
          }
          lVar11 = lVar11 + 0x30;
        }
      }
      if (art->curses != (int *)0x0) {
        lVar11 = 0x10;
        paVar14 = z_info;
        for (uVar21 = 1; uVar21 < paVar14->curse_max; uVar21 = uVar21 + 1) {
          if (art->curses[uVar21] != 0) {
            file_putf(f,"curse:%s:%d\n",*(undefined8 *)(curses->conflict_flags + lVar11 * 4 + -0x28)
                     );
            paVar14 = z_info;
          }
          lVar11 = lVar11 + 0xe;
        }
      }
      if (art->activation == (activation *)0x0) {
        if (poVar13->activation != (activation *)0x0) {
          file_putf(f,"act:%s\n",poVar13->activation->name);
          wVar17 = (poVar13->time).base;
          wVar15 = (poVar13->time).dice;
          wVar9 = (poVar13->time).sides;
          goto LAB_00183f41;
        }
      }
      else {
        file_putf(f,"act:%s\n",art->activation->name);
        wVar17 = (art->time).base;
        wVar15 = (art->time).dice;
        wVar9 = (art->time).sides;
LAB_00183f41:
        file_putf(f,"time:%d+%dd%d\n",(ulong)(uint)wVar17,(ulong)(uint)wVar15,(ulong)(uint)wVar9);
      }
      file_putf(f,"desc:%s\n",art->text);
      file_putf(f,"\n");
    }
    z_info->a_max = z_info->a_max + 1;
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

void initialize_random_artifacts(uint32_t randart_seed)
{
	char fname[1024];
	ang_file *randart_file = NULL;
	int i;

	/* Prepare to use the Angband "simple" RNG. */
	Rand_value = randart_seed;
	Rand_quick = true;

	/* Open the file, write a header */
	path_build(fname, sizeof(fname), ANGBAND_DIR_USER, "randart.txt");
	randart_file = file_open(fname, MODE_WRITE, FTYPE_TEXT);
	if (!randart_file) {
		quit_fmt("Error - can't create %s.", fname);
	}
	file_putf(randart_file,
			  "# Artifact file for random artifacts with seed %08x\n\n\n",
			  randart_seed);

	/* Initialize, name and write artifacts to the file */
	a_info = mem_realloc(a_info,
		(z_info->a_max + ART_NUM_RANDOM) * sizeof(*a_info));
	aup_info = mem_realloc(aup_info,
		(z_info->a_max + ART_NUM_RANDOM) * sizeof(*aup_info));
	for (i = 0; i < ART_NUM_RANDOM; i++) {
		/* Extend the artifact array with a zero entry */
		struct artifact *art;
		art = &a_info[z_info->a_max];
		memset(art, 0, sizeof(*art));
		memset(&aup_info[z_info->a_max], 0, sizeof(*aup_info));
		aup_info[z_info->a_max].aidx = z_info->a_max;

		/* Design the artifact, storing information as we go along. */
		design_random_artifact(art);
		art->aidx = z_info->a_max;

		/* Write the entry to the randart file */
		write_randart_file_entry(randart_file, art);

		z_info->a_max += 1;
	}

	/* Close the file */
	if (!file_close(randart_file)) {
		quit_fmt("Error - can't close %s.", fname);
	}
}